

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O0

int Aig_RManTableHash(uint *pTruth,int nVars,int nBins,int *pPrimes)

{
  int iVar1;
  uint local_2c;
  uint uHash;
  int nWords;
  int i;
  int *pPrimes_local;
  int nBins_local;
  int nVars_local;
  uint *pTruth_local;
  
  iVar1 = Kit_TruthWordNum(nVars);
  local_2c = 0;
  for (uHash = 0; (int)uHash < iVar1; uHash = uHash + 1) {
    local_2c = pTruth[(int)uHash] * pPrimes[(int)(uHash & 0xf)] ^ local_2c;
  }
  return local_2c % (uint)nBins;
}

Assistant:

static inline int Aig_RManTableHash( unsigned * pTruth, int nVars, int nBins, int * pPrimes )
{
    int i, nWords = Kit_TruthWordNum( nVars );
    unsigned uHash = 0;
    for ( i = 0; i < nWords; i++ )
        uHash ^= pTruth[i] * pPrimes[i & 0xf];
    return (int)(uHash % nBins);
}